

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetAccessorTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  BinInputStream *stream;
  XMLURL xmlURL;
  XMLURL local_70 [88];
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argc != 2) {
    std::operator<<((ostream *)&std::cerr,
                    "Usage: NetAccessorTest url\n\nThis test reads data from the given url and writes the result\nto standard output.\n\nA variety of buffer sizes is are used during the test.\n\n"
                   );
    exit(1);
  }
  xercesc_4_0::XMLURL::XMLURL(local_70,argv[1],xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (xercesc_4_0::XMLPlatformUtils::fgNetAccessor != (long *)0x0) {
    stream = (BinInputStream *)
             (**(code **)(*xercesc_4_0::XMLPlatformUtils::fgNetAccessor + 0x18))
                       (xercesc_4_0::XMLPlatformUtils::fgNetAccessor,local_70,0);
    if (stream != (BinInputStream *)0x0) {
      exercise(stream);
      (**(code **)(*(long *)stream + 8))(stream);
      xercesc_4_0::XMLURL::~XMLURL(local_70);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,"No binary input stream created. Aborting.\n");
    exit(3);
  }
  std::operator<<((ostream *)&std::cerr,"No netaccessor is available. Aborting.\n");
  exit(2);
}

Assistant:

int
main(int argc, char** argv)
{
    // Init the XML platform
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException& toCatch)
    {
        std::cout << "Error during platform init! Message:\n"
             << toCatch.getMessage() << std::endl;
        return 1;
    }
    
    // Look for our one and only parameter
    if (argc != 2)
    {
    	std::cerr << "Usage: NetAccessorTest url\n"
    			"\n"
    			"This test reads data from the given url and writes the result\n"
    			"to standard output.\n"
    			"\n"
    			"A variety of buffer sizes is are used during the test.\n"
    			"\n"
    			;
    	exit(1);
    }
    
    // Get the URL
    char* url = argv[1];
    
    int r = 1;

    // Do the test
    try
    {
    	XMLURL xmlURL(url);
    	
		// Get the netaccessor
		XMLNetAccessor* na = XMLPlatformUtils::fgNetAccessor;
		if (na == 0)
		{
			std::cerr <<  "No netaccessor is available. Aborting.\n";
			exit(2);
		}
		
		// Build a binary input stream
		BinInputStream* is = na->makeNew(xmlURL);
		if (is == 0)
		{
			std::cerr <<  "No binary input stream created. Aborting.\n";
			exit(3);
		}
		
		// Exercise the inputstream
		exercise(*is);
		
		// Delete the is
		delete is;
		r = 0;
    }
    catch(const XMLException& toCatch)
    {
        std::cout << "Exception during test:\n    "
             << toCatch.getMessage()
             << std::endl;
    }

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return r;
}